

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aq.c
# Opt level: O1

int aq_add_adu(aq_t *q,adu_t *adu)

{
  unsigned_long uVar1;
  uint uVar2;
  void *__dest;
  void *pvVar3;
  dlist_t *pdVar4;
  void *pvVar5;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  int iVar9;
  long lVar10;
  dlist_s *pdVar11;
  uint uVar12;
  unsigned_long uVar13;
  int iVar14;
  dlist_t *pdVar15;
  bool bVar16;
  mp3_frame_t local_5e90;
  
  if (q == (aq_t *)0x0) {
    __assert_fail("q != NULL","/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/aq.c",
                  0x27a,"int aq_add_adu(aq_t *, adu_t *)");
  }
  if (adu == (adu_t *)0x0) {
    __assert_fail("adu != NULL","/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/aq.c"
                  ,0x27b,"int aq_add_adu(aq_t *, adu_t *)");
  }
  aq_enqueue_adu(q,adu);
  pdVar11 = (q->adus).end;
  if (pdVar11 == (dlist_s *)0x0) {
    __assert_fail("dlist != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/aq.c",0x1df,
                  "void aq_insert_dummy_adus(aq_t *)");
  }
  pvVar5 = pdVar11->data;
  if (pvVar5 == (void *)0x0) {
    __assert_fail("tail != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/aq.c",0x1e1,
                  "void aq_insert_dummy_adus(aq_t *)");
  }
  if (pdVar11->prev == (dlist_s *)0x0) {
    iVar14 = 0;
  }
  else {
    pvVar3 = pdVar11->prev->data;
    if (pvVar3 == (void *)0x0) {
      __assert_fail("prev != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/aq.c",0x1e6,
                    "void aq_insert_dummy_adus(aq_t *)");
    }
    iVar14 = (*(int *)((long)pvVar3 + 0x4eb0) + *(int *)((long)pvVar3 + 0x10)) -
             *(int *)((long)pvVar3 + 0x4e80);
  }
  iVar9 = *(int *)((long)pvVar5 + 0x10) - iVar14;
  if (0 < iVar9) {
    do {
      pdVar4 = (q->adus).end;
      if (pdVar4 == (dlist_t *)0x0) {
        __assert_fail("dlist != NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/aq.c",0x1bb,
                      "void aq_insert_dummy_adu(aq_t *, unsigned int)");
      }
      pvVar3 = pdVar4->data;
      if (pvVar3 == (void *)0x0) {
        __assert_fail("tail != NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/aq.c",0x1bd,
                      "void aq_insert_dummy_adu(aq_t *, unsigned int)");
      }
      __dest = malloc(0x5e60);
      if (__dest == (void *)0x0) {
        __assert_fail("dummy != NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/aq.c",0x1c0,
                      "void aq_insert_dummy_adu(aq_t *, unsigned int)");
      }
      memcpy(__dest,pvVar3,0x5e60);
      *(int *)((long)__dest + 0x10) = iVar14;
      pvVar3 = __dest;
      lVar10 = 0;
      do {
        lVar7 = 0x54;
        do {
          *(undefined4 *)((long)pvVar3 + lVar7 + -0x28) = 0;
          *(undefined4 *)((long)pvVar3 + lVar7 + -0x34) = 0;
          *(undefined4 *)((long)pvVar3 + lVar7 + -0x20) = 0;
          *(undefined4 *)((long)pvVar3 + lVar7) = 0;
          *(undefined8 *)((long)pvVar3 + lVar7 + -8) = 0;
          lVar7 = lVar7 + 0x1390;
        } while (lVar7 == 0x13e4);
        pvVar3 = (void *)((long)pvVar3 + 0x2728);
        bVar16 = lVar10 == 0;
        lVar10 = lVar10 + 1;
      } while (bVar16);
      *(undefined8 *)((long)__dest + 0x4e78) = 0;
      *(undefined8 *)((long)__dest + 0x4e80) = 0;
      pdVar4 = dlist_ins_before(&q->adus,pdVar4,__dest);
      if (pdVar4 == (dlist_t *)0x0) {
        __assert_fail("new != NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/aq.c",0x1d5,
                      "void aq_insert_dummy_adu(aq_t *, unsigned int)");
      }
      iVar9 = iVar9 - *(int *)((long)pvVar5 + 0x4eb0);
      iVar14 = 0;
    } while (0 < iVar9);
  }
  pdVar4 = (q->adus).dlist;
  if (pdVar4 == (dlist_t *)0x0) {
    __assert_fail("dlist != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/aq.c",0x255,
                  "int aq_need_adu(aq_t *)");
  }
  pvVar5 = pdVar4->data;
  if (pvVar5 == (void *)0x0) {
    __assert_fail("head != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/aq.c",599,
                  "int aq_need_adu(aq_t *)");
  }
  iVar14 = 0;
  pdVar11 = pdVar4;
  while( true ) {
    if (pdVar11 == (dlist_t *)0x0) {
      return 0;
    }
    pvVar3 = pdVar11->data;
    if (pvVar3 == (void *)0x0) {
      __assert_fail("adu != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/aq.c",0x262,
                    "int aq_need_adu(aq_t *)");
    }
    if (*(int *)((long)pvVar5 + 0x4eb0) <=
        (*(int *)((long)pvVar3 + 0x4e80) + iVar14) - *(int *)((long)pvVar3 + 0x10)) break;
    iVar14 = iVar14 + *(int *)((long)pvVar3 + 0x4eb0);
    pdVar11 = pdVar11->next;
  }
  if (pdVar11 == (dlist_t *)0x0) {
    return 0;
  }
  memcpy(&local_5e90,pvVar5,0x5e60);
  uVar13 = 0;
  memset(local_5e90.raw,0,4000);
  iVar14 = 0;
  pdVar15 = pdVar4;
  do {
    uVar1 = local_5e90.frame_data_size;
    if (pdVar15 == (dlist_t *)0x0) {
      __assert_fail("dlist != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/aq.c",0x213,
                    "void aq_make_frame(aq_t *)");
    }
    pvVar5 = pdVar15->data;
    if (pvVar5 == (void *)0x0) {
      __assert_fail("adu != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/aq.c",0x215,
                    "void aq_make_frame(aq_t *)");
    }
    uVar2 = iVar14 - *(int *)((long)pvVar5 + 0x10);
    lVar10 = (long)(int)uVar2;
    if (lVar10 <= (long)local_5e90.frame_data_size) {
      uVar13 = *(ulong *)((long)pvVar5 + 0x4e80) + lVar10;
      if ((long)local_5e90.frame_data_size <= (long)uVar13) {
        uVar13 = local_5e90.frame_data_size;
      }
      uVar12 = (uint)uVar13;
      uVar6 = 0;
      if (0 < (int)uVar12) {
        uVar6 = uVar12;
      }
      uVar8 = 0;
      if (0 < (int)uVar2) {
        uVar8 = (ulong)uVar2;
      }
      if (-1 < (int)uVar2) {
        uVar6 = uVar12 - uVar2;
      }
      if (uVar6 != 0) {
        uVar2 = (int)uVar2 >> 0x1f & -uVar2;
        if (*(ulong *)((long)pvVar5 + 0x4e80) < (ulong)(uVar6 + uVar2)) {
          __assert_fail("adu->adu_size >= from_offset + data_length",
                        "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/aq.c",0x237,
                        "void aq_make_frame(aq_t *)");
        }
        memcpy(local_5e90.raw +
               uVar8 + local_5e90.si_size + (ulong)(local_5e90.protected == '\0') * 2 + 4,
               (void *)((long)pvVar5 +
                       (ulong)uVar2 + 0x4ec4 +
                       *(long *)((long)pvVar5 + 0x4e68) +
                       (ulong)(*(char *)((long)pvVar5 + 2) == '\0') * 2),(ulong)uVar6);
      }
      iVar14 = iVar14 + *(int *)((long)pvVar5 + 0x4eb0);
      pdVar15 = pdVar15->next;
    }
  } while ((lVar10 <= (long)uVar1) && ((long)(int)uVar13 < (long)local_5e90.frame_data_size));
  pvVar5 = dlist_get(&q->adus,pdVar4);
  if (pvVar5 != (void *)0x0) {
    free(pvVar5);
    aq_enqueue_frame(q,&local_5e90);
    return 1;
  }
  __assert_fail("adu != NULL","/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/aq.c",
                0xac,"void aq_discard_top_adu(aq_t *)");
}

Assistant:

int aq_add_adu(aq_t *q, adu_t *adu) {
  assert(q != NULL);
  assert(adu != NULL);

  aq_enqueue_adu(q, adu);
  aq_insert_dummy_adus(q);

  if (aq_need_adu(q)) {
    aq_make_frame(q);
    return 1;
  } else {
    return 0;
  }
}